

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86.cpp
# Opt level: O2

int __thiscall
ncnn::MultiHeadAttention_x86::create_pipeline(MultiHeadAttention_x86 *this,Option *opt)

{
  int *piVar1;
  undefined4 uVar2;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined4 uVar10;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  size_t *psVar18;
  Layer *pLVar19;
  long lVar20;
  _func_int *p_Var21;
  float fVar22;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar23;
  undefined1 in_XMM1 [16];
  undefined1 auVar24 [16];
  ParamDict pd;
  Option opt1;
  size_t local_98 [2];
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined8 local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined8 local_50;
  ModelBinFromMatArray local_48;
  float local_34;
  undefined4 uVar4;
  undefined3 uVar6;
  undefined2 uVar8;
  undefined4 uVar12;
  undefined3 uVar14;
  undefined2 uVar16;
  
  fVar22 = (float)(*(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]) /
                  *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  auVar24._4_4_ = in_XMM0_Db;
  auVar24._0_4_ = fVar22;
  auVar24._8_4_ = in_XMM0_Dc;
  auVar24._12_4_ = in_XMM0_Dd;
  auVar24 = rsqrtss(in_XMM1,auVar24);
  fVar23 = auVar24._0_4_;
  local_34 = fVar23 * -0.5 * (fVar22 * fVar23 * fVar23 + -3.0);
  pLVar19 = create_layer(0x4a);
  this->q_gemm = pLVar19;
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,local_34);
  ParamDict::set(&pd,1,1.0);
  ParamDict::set(&pd,2,0);
  ParamDict::set(&pd,3,1);
  ParamDict::set(&pd,4,1);
  ParamDict::set(&pd,5,0);
  ParamDict::set(&pd,6,1);
  ParamDict::set(&pd,7,*(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&pd,8,0);
  ParamDict::set(&pd,9,*(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&pd,10,1);
  ParamDict::set(&pd,0xb,0);
  ParamDict::set(&pd,0xc,1);
  ParamDict::set(&pd,0xe,0);
  (*this->q_gemm->_vptr_Layer[2])(this->q_gemm,&pd);
  local_98[0] = 0;
  opt1.lightmode = false;
  opt1._1_3_ = 0;
  opt1.num_threads = 0;
  opt1.blob_allocator._0_4_ = 0;
  opt1.blob_allocator._4_4_ = 0;
  opt1.workspace_allocator._0_4_ = 0;
  opt1.workspace_allocator._4_4_ = 0;
  opt1.openmp_blocktime = 0;
  opt1.use_bf16_storage = false;
  opt1.use_fp16_packed = false;
  opt1.use_fp16_storage = false;
  opt1.use_fp16_arithmetic = false;
  opt1.use_int8_packed = false;
  opt1.use_int8_storage = false;
  opt1.use_int8_arithmetic = false;
  opt1.use_packing_layout = false;
  opt1.use_shader_pack8 = false;
  opt1.use_subgroup_basic = false;
  opt1.use_subgroup_vote = false;
  opt1.use_subgroup_ballot = false;
  opt1.use_subgroup_shuffle = false;
  opt1.use_image_storage = false;
  opt1.use_tensor_storage = false;
  opt1.use_reserved_0 = false;
  opt1.flush_denormals = 0;
  opt1.use_local_pool_allocator = false;
  opt1.use_shader_local_memory = false;
  opt1.use_cooperative_matrix = false;
  opt1.use_winograd23_convolution = false;
  opt1.use_winograd43_convolution = false;
  opt1.use_winograd63_convolution = false;
  opt1.use_a53_a55_optimized_kernel = false;
  opt1.use_reserved_7 = false;
  p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&opt1 != (Option *)(&this->field_0xe8 + (long)p_Var21)) {
    piVar1 = *(int **)(&this->field_0xf0 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    opt1._0_8_ = *(undefined8 *)(&this->field_0xe8 + (long)p_Var21);
    opt1.blob_allocator._0_4_ = (undefined4)*(undefined8 *)(&this->field_0xf0 + (long)p_Var21);
    opt1.blob_allocator._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0xf0 + (long)p_Var21) >> 0x20);
    opt1.workspace_allocator._0_4_ = (undefined4)*(undefined8 *)(&this->field_0xf8 + (long)p_Var21);
    opt1.workspace_allocator._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0xf8 + (long)p_Var21) >> 0x20);
    opt1.openmp_blocktime = *(int *)(&this->field_0x100 + (long)p_Var21);
    opt1._32_8_ = *(undefined8 *)(&this->field_0x108 + (long)p_Var21);
    opt1._40_4_ = *(undefined4 *)(&this->field_0x110 + (long)p_Var21);
    opt1._44_4_ = *(undefined4 *)(&this->field_0x114 + (long)p_Var21);
    opt1.flush_denormals = *(int *)(&this->field_0x118 + (long)p_Var21);
    opt1._52_8_ = *(undefined8 *)(&this->field_0x11c + (long)p_Var21);
    local_98[0] = *(size_t *)(&this->field_0x128 + (long)p_Var21);
    p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
  }
  local_50 = 0;
  local_58 = 0;
  uStack_5c = 0;
  uStack_60 = 0;
  uStack_64 = 0;
  uStack_68 = 0;
  local_70 = 0;
  local_78 = 0;
  uStack_7c = 0;
  local_80 = 0;
  uStack_84 = 0;
  uStack_88 = 0;
  local_98[1] = 0;
  psVar18 = local_98 + 1;
  if (psVar18 != (size_t *)(&this->field_0x130 + (long)p_Var21)) {
    piVar1 = *(int **)(&this->field_0x138 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_98[1] = *(size_t *)(&this->field_0x130 + (long)p_Var21);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x138 + (long)p_Var21);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x138 + (long)p_Var21) >> 0x20);
    local_80 = (undefined4)*(undefined8 *)(&this->field_0x140 + (long)p_Var21);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x140 + (long)p_Var21) >> 0x20);
    local_78 = *(undefined4 *)(&this->field_0x148 + (long)p_Var21);
    local_70 = *(undefined8 *)(&this->field_0x150 + (long)p_Var21);
    uStack_68 = (undefined4)*(undefined8 *)(&this->field_0x158 + (long)p_Var21);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x158 + (long)p_Var21) >> 0x20);
    uStack_60 = (undefined4)*(undefined8 *)(&this->field_0x160 + (long)p_Var21);
    uStack_5c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x160 + (long)p_Var21) >> 0x20);
    local_58 = *(undefined4 *)(&this->field_0x168 + (long)p_Var21);
    local_50 = *(undefined8 *)(&this->field_0x170 + (long)p_Var21);
  }
  pLVar19 = this->q_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,(Mat *)&opt1);
  (*pLVar19->_vptr_Layer[3])(pLVar19,&local_48);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  (*this->q_gemm->_vptr_Layer[4])(this->q_gemm,opt);
  if (opt->lightmode != false) {
    p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0xf0 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x108 + (long)p_Var21) == (long *)0x0) {
          free(*(void **)(&this->field_0xe8 + (long)p_Var21));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x108 + (long)p_Var21) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x128 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0xf4 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0xfc + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0xe8 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0xf0 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x110 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x118 + (long)p_Var21) = 0;
    *(undefined4 *)(&this->field_0x120 + (long)p_Var21) = 0;
    p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x138 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var21) == (long *)0x0) {
          free(*(void **)(&this->field_0x130 + (long)p_Var21));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var21) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var21) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var21) = 0;
  }
  lVar20 = 0x48;
  do {
    piVar1 = *(int **)((long)&opt1.blob_allocator + lVar20);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&opt1.use_bf16_storage + lVar20) == (long *)0x0) {
          free(*(void **)(&opt1.lightmode + lVar20));
        }
        else {
          (**(code **)(**(long **)(&opt1.use_bf16_storage + lVar20) + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)local_98 + lVar20) = 0;
    *(undefined8 *)((long)&opt1.blob_allocator + lVar20 + 4) = 0;
    *(undefined8 *)((long)&opt1.workspace_allocator + lVar20 + 4) = 0;
    *(undefined8 *)(&opt1.lightmode + lVar20) = 0;
    *(undefined8 *)((long)&opt1.blob_allocator + lVar20) = 0;
    *(undefined4 *)(&opt1.use_winograd43_convolution + lVar20) = 0;
    *(undefined8 *)(&opt1.use_shader_pack8 + lVar20) = 0;
    *(undefined8 *)((long)&opt1.flush_denormals + lVar20) = 0;
    lVar20 = lVar20 + -0x48;
  } while (lVar20 != -0x48);
  ParamDict::~ParamDict(&pd);
  pLVar19 = create_layer(0x4a);
  this->k_gemm = pLVar19;
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,2,0);
  ParamDict::set(&pd,3,1);
  ParamDict::set(&pd,4,1);
  ParamDict::set(&pd,5,0);
  ParamDict::set(&pd,6,1);
  ParamDict::set(&pd,7,*(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&pd,8,0);
  ParamDict::set(&pd,9,*(int *)(&this->field_0xdc + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&pd,10,1);
  ParamDict::set(&pd,0xb,0);
  ParamDict::set(&pd,0xc,1);
  ParamDict::set(&pd,0xe,0);
  (*this->k_gemm->_vptr_Layer[2])(this->k_gemm,&pd);
  local_98[0] = 0;
  opt1.lightmode = false;
  opt1._1_3_ = 0;
  opt1.num_threads = 0;
  opt1.blob_allocator._0_4_ = 0;
  opt1.blob_allocator._4_4_ = 0;
  opt1.workspace_allocator._0_4_ = 0;
  opt1.workspace_allocator._4_4_ = 0;
  opt1.openmp_blocktime = 0;
  opt1.use_bf16_storage = false;
  opt1.use_fp16_packed = false;
  opt1.use_fp16_storage = false;
  opt1.use_fp16_arithmetic = false;
  opt1.use_int8_packed = false;
  opt1.use_int8_storage = false;
  opt1.use_int8_arithmetic = false;
  opt1.use_packing_layout = false;
  opt1.use_shader_pack8 = false;
  opt1.use_subgroup_basic = false;
  opt1.use_subgroup_vote = false;
  opt1.use_subgroup_ballot = false;
  opt1.use_subgroup_shuffle = false;
  opt1.use_image_storage = false;
  opt1.use_tensor_storage = false;
  opt1.use_reserved_0 = false;
  opt1.flush_denormals = 0;
  opt1.use_local_pool_allocator = false;
  opt1.use_shader_local_memory = false;
  opt1.use_cooperative_matrix = false;
  opt1.use_winograd23_convolution = false;
  opt1.use_winograd43_convolution = false;
  opt1.use_winograd63_convolution = false;
  opt1.use_a53_a55_optimized_kernel = false;
  opt1.use_reserved_7 = false;
  p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
  if ((Mat *)&opt1 != (Mat *)(&this->field_0x178 + (long)p_Var21)) {
    piVar1 = *(int **)(&this->field_0x180 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    opt1._0_8_ = *(undefined8 *)(&this->field_0x178 + (long)p_Var21);
    opt1.blob_allocator._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x180 + (long)p_Var21);
    opt1.blob_allocator._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x180 + (long)p_Var21) >> 0x20);
    opt1.workspace_allocator._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x188 + (long)p_Var21)
    ;
    opt1.workspace_allocator._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x188 + (long)p_Var21) >> 0x20);
    opt1.openmp_blocktime = *(int *)(&this->field_0x190 + (long)p_Var21);
    opt1._32_8_ = *(undefined8 *)(&this->field_0x198 + (long)p_Var21);
    opt1._40_4_ = *(undefined4 *)(&this->field_0x1a0 + (long)p_Var21);
    opt1._44_4_ = *(undefined4 *)(&this->field_0x1a4 + (long)p_Var21);
    opt1.flush_denormals = *(int *)(&this->field_0x1a8 + (long)p_Var21);
    opt1._52_8_ = *(undefined8 *)(&this->field_0x1ac + (long)p_Var21);
    local_98[0] = *(size_t *)(&this->field_0x1b8 + (long)p_Var21);
    p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
  }
  local_50 = 0;
  local_58 = 0;
  uStack_5c = 0;
  uStack_60 = 0;
  uStack_64 = 0;
  uStack_68 = 0;
  local_70 = 0;
  local_78 = 0;
  uStack_7c = 0;
  local_80 = 0;
  uStack_84 = 0;
  uStack_88 = 0;
  local_98[1] = 0;
  if (psVar18 != (size_t *)(&this->field_0x1c0 + (long)p_Var21)) {
    piVar1 = *(int **)(&this->field_0x1c8 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_98[1] = *(size_t *)(&this->field_0x1c0 + (long)p_Var21);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var21);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var21) >> 0x20);
    local_80 = (undefined4)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var21);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var21) >> 0x20);
    local_78 = *(undefined4 *)(&this->field_0x1d8 + (long)p_Var21);
    local_70 = *(undefined8 *)(&this->field_0x1e0 + (long)p_Var21);
    uStack_68 = (undefined4)*(undefined8 *)(&this->field_0x1e8 + (long)p_Var21);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1e8 + (long)p_Var21) >> 0x20);
    uStack_60 = (undefined4)*(undefined8 *)(&this->field_0x1f0 + (long)p_Var21);
    uStack_5c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1f0 + (long)p_Var21) >> 0x20);
    local_58 = *(undefined4 *)(&this->field_0x1f8 + (long)p_Var21);
    local_50 = *(undefined8 *)(&this->field_0x200 + (long)p_Var21);
  }
  pLVar19 = this->k_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,(Mat *)&opt1);
  (*pLVar19->_vptr_Layer[3])(pLVar19,&local_48);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  (*this->k_gemm->_vptr_Layer[4])(this->k_gemm,opt);
  if (opt->lightmode != false) {
    p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x180 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x198 + (long)p_Var21) == (long *)0x0) {
          free(*(void **)(&this->field_0x178 + (long)p_Var21));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x198 + (long)p_Var21) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1b8 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x184 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x18c + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x180 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x1a8 + (long)p_Var21) = 0;
    *(undefined4 *)(&this->field_0x1b0 + (long)p_Var21) = 0;
    p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x1c8 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x1e0 + (long)p_Var21) == (long *)0x0) {
          free(*(void **)(&this->field_0x1c0 + (long)p_Var21));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x1e0 + (long)p_Var21) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x200 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x1cc + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x1d4 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x1c0 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x1c8 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x1e8 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x1f0 + (long)p_Var21) = 0;
    *(undefined4 *)(&this->field_0x1f8 + (long)p_Var21) = 0;
  }
  lVar20 = 0x48;
  do {
    piVar1 = *(int **)((long)&opt1.blob_allocator + lVar20);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&opt1.use_bf16_storage + lVar20) == (long *)0x0) {
          free(*(void **)(&opt1.lightmode + lVar20));
        }
        else {
          (**(code **)(**(long **)(&opt1.use_bf16_storage + lVar20) + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)local_98 + lVar20) = 0;
    *(undefined8 *)((long)&opt1.blob_allocator + lVar20 + 4) = 0;
    *(undefined8 *)((long)&opt1.workspace_allocator + lVar20 + 4) = 0;
    *(undefined8 *)(&opt1.lightmode + lVar20) = 0;
    *(undefined8 *)((long)&opt1.blob_allocator + lVar20) = 0;
    *(undefined4 *)(&opt1.use_winograd43_convolution + lVar20) = 0;
    *(undefined8 *)(&opt1.use_shader_pack8 + lVar20) = 0;
    *(undefined8 *)((long)&opt1.flush_denormals + lVar20) = 0;
    lVar20 = lVar20 + -0x48;
  } while (lVar20 != -0x48);
  ParamDict::~ParamDict(&pd);
  pLVar19 = create_layer(0x4a);
  this->v_gemm = pLVar19;
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,2,0);
  ParamDict::set(&pd,3,1);
  ParamDict::set(&pd,4,1);
  ParamDict::set(&pd,5,0);
  ParamDict::set(&pd,6,1);
  ParamDict::set(&pd,7,*(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&pd,8,0);
  ParamDict::set(&pd,9,*(int *)(&this->field_0xe0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&pd,10,1);
  ParamDict::set(&pd,0xb,0);
  ParamDict::set(&pd,0xc,1);
  ParamDict::set(&pd,0xe,0);
  (*this->v_gemm->_vptr_Layer[2])(this->v_gemm,&pd);
  local_98[0] = 0;
  opt1.lightmode = false;
  opt1._1_3_ = 0;
  opt1.num_threads = 0;
  opt1.blob_allocator._0_4_ = 0;
  opt1.blob_allocator._4_4_ = 0;
  opt1.workspace_allocator._0_4_ = 0;
  opt1.workspace_allocator._4_4_ = 0;
  opt1.openmp_blocktime = 0;
  opt1.use_bf16_storage = false;
  opt1.use_fp16_packed = false;
  opt1.use_fp16_storage = false;
  opt1.use_fp16_arithmetic = false;
  opt1.use_int8_packed = false;
  opt1.use_int8_storage = false;
  opt1.use_int8_arithmetic = false;
  opt1.use_packing_layout = false;
  opt1.use_shader_pack8 = false;
  opt1.use_subgroup_basic = false;
  opt1.use_subgroup_vote = false;
  opt1.use_subgroup_ballot = false;
  opt1.use_subgroup_shuffle = false;
  opt1.use_image_storage = false;
  opt1.use_tensor_storage = false;
  opt1.use_reserved_0 = false;
  opt1.flush_denormals = 0;
  opt1.use_local_pool_allocator = false;
  opt1.use_shader_local_memory = false;
  opt1.use_cooperative_matrix = false;
  opt1.use_winograd23_convolution = false;
  opt1.use_winograd43_convolution = false;
  opt1.use_winograd63_convolution = false;
  opt1.use_a53_a55_optimized_kernel = false;
  opt1.use_reserved_7 = false;
  p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
  if ((Mat *)&opt1 != (Mat *)(&this->field_0x208 + (long)p_Var21)) {
    piVar1 = *(int **)(&this->field_0x210 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    opt1._0_8_ = *(undefined8 *)(&this->field_0x208 + (long)p_Var21);
    opt1.blob_allocator._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x210 + (long)p_Var21);
    opt1.blob_allocator._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x210 + (long)p_Var21) >> 0x20);
    opt1.workspace_allocator._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x218 + (long)p_Var21)
    ;
    opt1.workspace_allocator._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x218 + (long)p_Var21) >> 0x20);
    opt1.openmp_blocktime = *(int *)(&this->field_0x220 + (long)p_Var21);
    opt1._32_8_ = *(undefined8 *)(&this->field_0x228 + (long)p_Var21);
    opt1._40_4_ = *(undefined4 *)(&this->field_0x230 + (long)p_Var21);
    opt1._44_4_ = *(undefined4 *)(&this->field_0x234 + (long)p_Var21);
    opt1.flush_denormals = *(int *)(&this->field_0x238 + (long)p_Var21);
    opt1._52_8_ = *(undefined8 *)(&this->field_0x23c + (long)p_Var21);
    local_98[0] = *(size_t *)(&this->field_0x248 + (long)p_Var21);
    p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
  }
  local_50 = 0;
  local_58 = 0;
  uStack_5c = 0;
  uStack_60 = 0;
  uStack_64 = 0;
  uStack_68 = 0;
  local_70 = 0;
  local_78 = 0;
  uStack_7c = 0;
  local_80 = 0;
  uStack_84 = 0;
  uStack_88 = 0;
  local_98[1] = 0;
  if (psVar18 != (size_t *)(&this->field_0x250 + (long)p_Var21)) {
    piVar1 = *(int **)(&this->field_0x258 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_98[1] = *(size_t *)(&this->field_0x250 + (long)p_Var21);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x258 + (long)p_Var21);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x258 + (long)p_Var21) >> 0x20);
    local_80 = (undefined4)*(undefined8 *)(&this->field_0x260 + (long)p_Var21);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x260 + (long)p_Var21) >> 0x20);
    local_78 = *(undefined4 *)(&this->field_0x268 + (long)p_Var21);
    local_70 = *(undefined8 *)(&this->field_0x270 + (long)p_Var21);
    uStack_68 = (undefined4)*(undefined8 *)(&this->field_0x278 + (long)p_Var21);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x278 + (long)p_Var21) >> 0x20);
    uStack_60 = (undefined4)*(undefined8 *)(&this->field_0x280 + (long)p_Var21);
    uStack_5c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x280 + (long)p_Var21) >> 0x20);
    local_58 = *(undefined4 *)(&this->field_0x288 + (long)p_Var21);
    local_50 = *(undefined8 *)(&this->field_0x290 + (long)p_Var21);
  }
  pLVar19 = this->v_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,(Mat *)&opt1);
  (*pLVar19->_vptr_Layer[3])(pLVar19,&local_48);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  (*this->v_gemm->_vptr_Layer[4])(this->v_gemm,opt);
  if (opt->lightmode != false) {
    p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x210 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x228 + (long)p_Var21) == (long *)0x0) {
          free(*(void **)(&this->field_0x208 + (long)p_Var21));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x228 + (long)p_Var21) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x248 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x214 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x21c + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x208 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x210 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x230 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x238 + (long)p_Var21) = 0;
    *(undefined4 *)(&this->field_0x240 + (long)p_Var21) = 0;
    p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x258 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x270 + (long)p_Var21) == (long *)0x0) {
          free(*(void **)(&this->field_0x250 + (long)p_Var21));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x270 + (long)p_Var21) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x290 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x25c + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x264 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x250 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x258 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x278 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x280 + (long)p_Var21) = 0;
    *(undefined4 *)(&this->field_0x288 + (long)p_Var21) = 0;
  }
  lVar20 = 0x48;
  do {
    piVar1 = *(int **)((long)&opt1.blob_allocator + lVar20);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&opt1.use_bf16_storage + lVar20) == (long *)0x0) {
          free(*(void **)(&opt1.lightmode + lVar20));
        }
        else {
          (**(code **)(**(long **)(&opt1.use_bf16_storage + lVar20) + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)local_98 + lVar20) = 0;
    *(undefined8 *)((long)&opt1.blob_allocator + lVar20 + 4) = 0;
    *(undefined8 *)((long)&opt1.workspace_allocator + lVar20 + 4) = 0;
    *(undefined8 *)(&opt1.lightmode + lVar20) = 0;
    *(undefined8 *)((long)&opt1.blob_allocator + lVar20) = 0;
    *(undefined4 *)(&opt1.use_winograd43_convolution + lVar20) = 0;
    *(undefined8 *)(&opt1.use_shader_pack8 + lVar20) = 0;
    *(undefined8 *)((long)&opt1.flush_denormals + lVar20) = 0;
    lVar20 = lVar20 + -0x48;
  } while (lVar20 != -0x48);
  ParamDict::~ParamDict(&pd);
  pLVar19 = create_layer(0x4a);
  this->qk_gemm = pLVar19;
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,2,1);
  ParamDict::set(&pd,3,0);
  ParamDict::set(&pd,4,0);
  ParamDict::set(&pd,5,0);
  ParamDict::set(&pd,6,(uint)(*(int *)(&this->field_0xe4 +
                                      (long)this->_vptr_MultiHeadAttention_x86[-3]) == 0));
  ParamDict::set(&pd,7,0);
  ParamDict::set(&pd,8,0);
  ParamDict::set(&pd,9,0);
  ParamDict::set(&pd,10,-(uint)(*(int *)(&this->field_0xe4 +
                                        (long)this->_vptr_MultiHeadAttention_x86[-3]) == 0) | 3);
  ParamDict::set(&pd,0xb,0);
  ParamDict::set(&pd,0xc,1);
  (*this->qk_gemm->_vptr_Layer[2])();
  pLVar19 = this->qk_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&opt1,(Mat *)0x0);
  (*pLVar19->_vptr_Layer[3])(pLVar19,&opt1);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&opt1);
  opt1.blob_allocator._0_4_ = *(undefined4 *)&opt->blob_allocator;
  opt1.blob_allocator._4_4_ = *(undefined4 *)((long)&opt->blob_allocator + 4);
  uVar2 = opt->openmp_blocktime;
  uVar3 = opt->use_winograd_convolution;
  uVar5 = opt->use_sgemm_convolution;
  uVar7 = opt->use_int8_inference;
  uVar9 = opt->use_vulkan_compute;
  uVar8 = CONCAT11(uVar9,uVar7);
  uVar6 = CONCAT21(uVar8,uVar5);
  uVar4 = CONCAT31(uVar6,uVar3);
  opt1.use_bf16_storage = opt->use_bf16_storage;
  opt1.use_fp16_packed = opt->use_fp16_packed;
  opt1.use_fp16_storage = opt->use_fp16_storage;
  opt1.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt1.use_int8_packed = opt->use_int8_packed;
  opt1.use_int8_storage = opt->use_int8_storage;
  opt1.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt1.use_packing_layout = opt->use_packing_layout;
  opt1.use_shader_pack8 = opt->use_shader_pack8;
  opt1.use_subgroup_basic = opt->use_subgroup_basic;
  opt1.use_subgroup_vote = opt->use_subgroup_vote;
  opt1.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt1.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt1.use_image_storage = opt->use_image_storage;
  opt1.use_tensor_storage = opt->use_tensor_storage;
  opt1.use_reserved_0 = opt->use_reserved_0;
  opt1.flush_denormals = opt->flush_denormals;
  opt1.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt1.use_shader_local_memory = opt->use_shader_local_memory;
  opt1.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt1.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt1.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt1.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt1.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
  opt1.use_reserved_7 = opt->use_reserved_7;
  opt1.use_reserved_8 = opt->use_reserved_8;
  opt1.use_reserved_9 = opt->use_reserved_9;
  opt1.use_reserved_10 = opt->use_reserved_10;
  opt1.use_reserved_11 = opt->use_reserved_11;
  opt1.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
  opt1.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
  opt1.num_threads = 1;
  opt1.lightmode = opt->lightmode;
  opt1._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt1.openmp_blocktime = uVar2;
  opt1._28_4_ = uVar4;
  (*this->qk_gemm->_vptr_Layer[4])(this->qk_gemm,&opt1);
  ParamDict::~ParamDict(&pd);
  pLVar19 = create_layer(0x4a);
  this->qkv_gemm = pLVar19;
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,2,0);
  ParamDict::set(&pd,3,1);
  ParamDict::set(&pd,4,0);
  ParamDict::set(&pd,5,0);
  ParamDict::set(&pd,6,1);
  ParamDict::set(&pd,7,0);
  ParamDict::set(&pd,8,0);
  ParamDict::set(&pd,9,0);
  ParamDict::set(&pd,10,-1);
  ParamDict::set(&pd,0xb,0);
  ParamDict::set(&pd,0xc,1);
  ParamDict::set(&pd,0xe,1);
  (*this->qkv_gemm->_vptr_Layer[2])();
  pLVar19 = this->qkv_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&opt1,(Mat *)0x0);
  (*pLVar19->_vptr_Layer[3])(pLVar19,&opt1);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&opt1);
  opt1.blob_allocator._0_4_ = *(undefined4 *)&opt->blob_allocator;
  opt1.blob_allocator._4_4_ = *(undefined4 *)((long)&opt->blob_allocator + 4);
  uVar10 = opt->openmp_blocktime;
  uVar11 = opt->use_winograd_convolution;
  uVar13 = opt->use_sgemm_convolution;
  uVar15 = opt->use_int8_inference;
  uVar17 = opt->use_vulkan_compute;
  uVar16 = CONCAT11(uVar17,uVar15);
  uVar14 = CONCAT21(uVar16,uVar13);
  uVar12 = CONCAT31(uVar14,uVar11);
  opt1.use_bf16_storage = opt->use_bf16_storage;
  opt1.use_fp16_packed = opt->use_fp16_packed;
  opt1.use_fp16_storage = opt->use_fp16_storage;
  opt1.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt1.use_int8_packed = opt->use_int8_packed;
  opt1.use_int8_storage = opt->use_int8_storage;
  opt1.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt1.use_packing_layout = opt->use_packing_layout;
  opt1.use_shader_pack8 = opt->use_shader_pack8;
  opt1.use_subgroup_basic = opt->use_subgroup_basic;
  opt1.use_subgroup_vote = opt->use_subgroup_vote;
  opt1.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt1.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt1.use_image_storage = opt->use_image_storage;
  opt1.use_tensor_storage = opt->use_tensor_storage;
  opt1.use_reserved_0 = opt->use_reserved_0;
  opt1.flush_denormals = opt->flush_denormals;
  opt1.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt1.use_shader_local_memory = opt->use_shader_local_memory;
  opt1.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt1.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt1.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt1.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt1.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
  opt1.use_reserved_7 = opt->use_reserved_7;
  opt1.use_reserved_8 = opt->use_reserved_8;
  opt1.use_reserved_9 = opt->use_reserved_9;
  opt1.use_reserved_10 = opt->use_reserved_10;
  opt1.use_reserved_11 = opt->use_reserved_11;
  opt1.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
  opt1.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
  opt1.num_threads = 1;
  opt1.lightmode = opt->lightmode;
  opt1._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt1.openmp_blocktime = uVar10;
  opt1._28_4_ = uVar12;
  (*this->qkv_gemm->_vptr_Layer[4])();
  ParamDict::~ParamDict(&pd);
  pLVar19 = create_layer(0x20);
  this->qk_softmax = pLVar19;
  ParamDict::ParamDict((ParamDict *)&opt1);
  ParamDict::set((ParamDict *)&opt1,0,-1);
  ParamDict::set((ParamDict *)&opt1,1,1);
  (*this->qk_softmax->_vptr_Layer[2])();
  pLVar19 = this->qk_softmax;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd,(Mat *)0x0);
  (*pLVar19->_vptr_Layer[3])(pLVar19,&pd);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd);
  (*this->qk_softmax->_vptr_Layer[4])(this->qk_softmax,opt);
  ParamDict::~ParamDict((ParamDict *)&opt1);
  pLVar19 = create_layer(0x4a);
  this->o_gemm = pLVar19;
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,2,1);
  ParamDict::set(&pd,3,1);
  ParamDict::set(&pd,4,0);
  ParamDict::set(&pd,5,1);
  ParamDict::set(&pd,6,1);
  ParamDict::set(&pd,7,0);
  ParamDict::set(&pd,8,*(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&pd,9,*(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&pd,10,4);
  ParamDict::set(&pd,0xb,0);
  (*this->o_gemm->_vptr_Layer[2])(this->o_gemm,&pd);
  local_98[0] = 0;
  opt1.lightmode = false;
  opt1._1_3_ = 0;
  opt1.num_threads = 0;
  opt1.blob_allocator._0_4_ = 0;
  opt1.blob_allocator._4_4_ = 0;
  opt1.workspace_allocator._0_4_ = 0;
  opt1.workspace_allocator._4_4_ = 0;
  opt1.openmp_blocktime = 0;
  opt1.use_bf16_storage = false;
  opt1.use_fp16_packed = false;
  opt1.use_fp16_storage = false;
  opt1.use_fp16_arithmetic = false;
  opt1.use_int8_packed = false;
  opt1.use_int8_storage = false;
  opt1.use_int8_arithmetic = false;
  opt1.use_packing_layout = false;
  opt1.use_shader_pack8 = false;
  opt1.use_subgroup_basic = false;
  opt1.use_subgroup_vote = false;
  opt1.use_subgroup_ballot = false;
  opt1.use_subgroup_shuffle = false;
  opt1.use_image_storage = false;
  opt1.use_tensor_storage = false;
  opt1.use_reserved_0 = false;
  opt1.flush_denormals = 0;
  opt1.use_local_pool_allocator = false;
  opt1.use_shader_local_memory = false;
  opt1.use_cooperative_matrix = false;
  opt1.use_winograd23_convolution = false;
  opt1.use_winograd43_convolution = false;
  opt1.use_winograd63_convolution = false;
  opt1.use_a53_a55_optimized_kernel = false;
  opt1.use_reserved_7 = false;
  p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&opt1 != (Option *)(&this->field_0x298 + (long)p_Var21)) {
    piVar1 = *(int **)(&this->field_0x2a0 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    opt1._0_8_ = *(undefined8 *)(&this->field_0x298 + (long)p_Var21);
    opt1.blob_allocator._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x2a0 + (long)p_Var21);
    opt1.blob_allocator._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x2a0 + (long)p_Var21) >> 0x20);
    opt1.workspace_allocator._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x2a8 + (long)p_Var21)
    ;
    opt1.workspace_allocator._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x2a8 + (long)p_Var21) >> 0x20);
    opt1.openmp_blocktime = *(int *)(&this->field_0x2b0 + (long)p_Var21);
    opt1._32_8_ = *(undefined8 *)(&this->field_0x2b8 + (long)p_Var21);
    opt1._40_4_ = *(undefined4 *)(&this->field_0x2c0 + (long)p_Var21);
    opt1._44_4_ = *(undefined4 *)(&this->field_0x2c4 + (long)p_Var21);
    opt1.flush_denormals = *(int *)(&this->field_0x2c8 + (long)p_Var21);
    opt1._52_8_ = *(undefined8 *)(&this->field_0x2cc + (long)p_Var21);
    local_98[0] = *(size_t *)(&this->field_0x2d8 + (long)p_Var21);
    p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
  }
  local_50 = 0;
  local_58 = 0;
  uStack_5c = 0;
  uStack_60 = 0;
  uStack_64 = 0;
  uStack_68 = 0;
  local_70 = 0;
  local_78 = 0;
  uStack_7c = 0;
  local_80 = 0;
  uStack_84 = 0;
  uStack_88 = 0;
  local_98[1] = 0;
  if (psVar18 != (size_t *)(&this->field_0x2e0 + (long)p_Var21)) {
    piVar1 = *(int **)(&this->field_0x2e8 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_98[1] = *(size_t *)(&this->field_0x2e0 + (long)p_Var21);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x2e8 + (long)p_Var21);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x2e8 + (long)p_Var21) >> 0x20);
    local_80 = (undefined4)*(undefined8 *)(&this->field_0x2f0 + (long)p_Var21);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x2f0 + (long)p_Var21) >> 0x20);
    local_78 = *(undefined4 *)(&this->field_0x2f8 + (long)p_Var21);
    local_70 = *(undefined8 *)(&this->field_0x300 + (long)p_Var21);
    uStack_68 = (undefined4)*(undefined8 *)(&this->field_0x308 + (long)p_Var21);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x308 + (long)p_Var21) >> 0x20);
    uStack_60 = (undefined4)*(undefined8 *)(&this->field_0x310 + (long)p_Var21);
    uStack_5c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x310 + (long)p_Var21) >> 0x20);
    local_58 = *(undefined4 *)(&this->field_0x318 + (long)p_Var21);
    local_50 = *(undefined8 *)(&this->field_0x320 + (long)p_Var21);
  }
  pLVar19 = this->o_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,(Mat *)&opt1);
  (*pLVar19->_vptr_Layer[3])(pLVar19,&local_48);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  (*this->o_gemm->_vptr_Layer[4])(this->o_gemm,opt);
  if (opt->lightmode != false) {
    p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x2a0 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x2b8 + (long)p_Var21) == (long *)0x0) {
          free(*(void **)(&this->field_0x298 + (long)p_Var21));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x2b8 + (long)p_Var21) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x2d8 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x2a4 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x2ac + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x298 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x2a0 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x2c0 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x2c8 + (long)p_Var21) = 0;
    *(undefined4 *)(&this->field_0x2d0 + (long)p_Var21) = 0;
    p_Var21 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x2e8 + (long)p_Var21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x300 + (long)p_Var21) == (long *)0x0) {
          free(*(void **)(&this->field_0x2e0 + (long)p_Var21));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x300 + (long)p_Var21) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x320 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x2ec + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x2f4 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x2e0 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x2e8 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x308 + (long)p_Var21) = 0;
    *(undefined8 *)(&this->field_0x310 + (long)p_Var21) = 0;
    *(undefined4 *)(&this->field_0x318 + (long)p_Var21) = 0;
  }
  lVar20 = 0x48;
  do {
    piVar1 = *(int **)((long)&opt1.blob_allocator + lVar20);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&opt1.use_bf16_storage + lVar20) == (long *)0x0) {
          free(*(void **)(&opt1.lightmode + lVar20));
        }
        else {
          (**(code **)(**(long **)(&opt1.use_bf16_storage + lVar20) + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)local_98 + lVar20) = 0;
    *(undefined8 *)((long)&opt1.blob_allocator + lVar20 + 4) = 0;
    *(undefined8 *)((long)&opt1.workspace_allocator + lVar20 + 4) = 0;
    *(undefined8 *)(&opt1.lightmode + lVar20) = 0;
    *(undefined8 *)((long)&opt1.blob_allocator + lVar20) = 0;
    *(undefined4 *)(&opt1.use_winograd43_convolution + lVar20) = 0;
    *(undefined8 *)(&opt1.use_shader_pack8 + lVar20) = 0;
    *(undefined8 *)((long)&opt1.flush_denormals + lVar20) = 0;
    lVar20 = lVar20 + -0x48;
  } while (lVar20 != -0x48);
  ParamDict::~ParamDict(&pd);
  return 0;
}

Assistant:

int MultiHeadAttention_x86::create_pipeline(const Option& opt)
{
    {
        const int embed_dim_per_head = embed_dim / num_heads;
        const float inv_sqrt_embed_dim_per_head = 1.f / sqrtf(embed_dim_per_head);

        q_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(0, inv_sqrt_embed_dim_per_head);
        pd.set(1, 1.f);
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, embed_dim); // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        q_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = q_weight_data;
        weights[1] = q_bias_data;
        q_gemm->load_model(ModelBinFromMatArray(weights));
        q_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            q_weight_data.release();
            q_bias_data.release();
        }
    }

    {
        k_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, kdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        k_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = k_weight_data;
        weights[1] = k_bias_data;
        k_gemm->load_model(ModelBinFromMatArray(weights));
        k_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            k_weight_data.release();
            k_bias_data.release();
        }
    }

    {
        v_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, vdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        v_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = v_weight_data;
        weights[1] = v_bias_data;
        v_gemm->load_model(ModelBinFromMatArray(weights));
        v_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            v_weight_data.release();
            v_bias_data.release();
        }
    }

    {
        qk_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 0);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, attn_mask ? 0 : 1);   // constantC
        pd.set(7, 0);                   // M
        pd.set(8, 0);                   // N
        pd.set(9, 0);                   // K
        pd.set(10, attn_mask ? 3 : -1); // constant_broadcast_type_C
        pd.set(11, 0);                  // output_N1M
        pd.set(12, 1);                  // output_elempack
        qk_gemm->load_param(pd);
        qk_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->create_pipeline(opt1);
    }
    {
        qkv_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);   // transA
        pd.set(3, 1);   // transB
        pd.set(4, 0);   // constantA
        pd.set(5, 0);   // constantB
        pd.set(6, 1);   // constantC
        pd.set(7, 0);   // M
        pd.set(8, 0);   // N
        pd.set(9, 0);   // K
        pd.set(10, -1); // constant_broadcast_type_C
        pd.set(11, 0);  // output_N1M
        pd.set(12, 1);  // output_elempack
        pd.set(14, 1);  // output_transpose
        qkv_gemm->load_param(pd);
        qkv_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->create_pipeline(opt1);
    }

    {
        qk_softmax = ncnn::create_layer(ncnn::LayerType::Softmax);
        ncnn::ParamDict pd;
        pd.set(0, -1);
        pd.set(1, 1);
        qk_softmax->load_param(pd);
        qk_softmax->load_model(ModelBinFromMatArray(0));
        qk_softmax->create_pipeline(opt);
    }

    {
        o_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 0);         // constantA
        pd.set(5, 1);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, 0);         // M = outch
        pd.set(8, embed_dim); // N = size
        pd.set(9, embed_dim); // K = maxk*inch
        pd.set(10, 4);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        o_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = out_weight_data;
        weights[1] = out_bias_data;
        o_gemm->load_model(ModelBinFromMatArray(weights));
        o_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            out_weight_data.release();
            out_bias_data.release();
        }
    }

    return 0;
}